

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSEngine.cpp
# Opt level: O0

void __thiscall PSEngine::apply_rule(PSEngine *this,Rule *p_rule)

{
  bool bVar1;
  unordered_set<PSVector2i,_std::hash<PSVector2i>,_std::equal_to<PSVector2i>,_std::allocator<PSVector2i>_>
  *this_00;
  size_type sVar2;
  reference pAVar3;
  size_type sVar4;
  reference this_01;
  pointer *this_02;
  reference p_delta;
  RuleApplicationDelta *delta;
  iterator __end1_1;
  iterator __begin1_1;
  vector<PSEngine::RuleApplicationDelta,_std::allocator<PSEngine::RuleApplicationDelta>_>
  *__range1_1;
  pointer pPStack_1c0;
  pointer local_1b8;
  anon_class_48_6_f23fcb61 local_1b0;
  undefined1 local_180 [8];
  function<void_(int,_std::vector<PSEngine::PatternMatchInformation,_std::allocator<PSEngine::PatternMatchInformation>_>)>
  compute_pattern_match_combinations;
  iterator iStack_158;
  AbsoluteDirection rule_app_dir;
  iterator __end1;
  iterator __begin1;
  set<PSEngine::AbsoluteDirection,_std::less<PSEngine::AbsoluteDirection>,_std::allocator<PSEngine::AbsoluteDirection>_>
  *__range1;
  set<PSEngine::AbsoluteDirection,_std::less<PSEngine::AbsoluteDirection>,_std::allocator<PSEngine::AbsoluteDirection>_>
  application_directions;
  RuleDelta rule_delta;
  undefined1 local_58 [8];
  optional<std::unordered_set<PSVector2i,_std::hash<PSVector2i>,_std::equal_to<PSVector2i>,_std::allocator<PSVector2i>_>_>
  application_positions;
  Rule *p_rule_local;
  PSEngine *this_local;
  
  application_positions.
  super__Optional_base<std::unordered_set<PSVector2i,_std::hash<PSVector2i>,_std::equal_to<PSVector2i>,_std::allocator<PSVector2i>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::unordered_set<PSVector2i,_std::hash<PSVector2i>,_std::equal_to<PSVector2i>,_std::allocator<PSVector2i>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::unordered_set<PSVector2i,_std::hash<PSVector2i>,_std::equal_to<PSVector2i>,_std::allocator<PSVector2i>_>_>
  ._56_8_ = p_rule;
  find_cells_for_rule_application
            ((optional<std::unordered_set<PSVector2i,_std::hash<PSVector2i>,_std::equal_to<PSVector2i>,_std::allocator<PSVector2i>_>_>
              *)local_58,this,p_rule);
  bVar1 = std::
          optional<std::unordered_set<PSVector2i,_std::hash<PSVector2i>,_std::equal_to<PSVector2i>,_std::allocator<PSVector2i>_>_>
          ::has_value((optional<std::unordered_set<PSVector2i,_std::hash<PSVector2i>,_std::equal_to<PSVector2i>,_std::allocator<PSVector2i>_>_>
                       *)local_58);
  if (bVar1) {
    this_00 = std::
              optional<std::unordered_set<PSVector2i,_std::hash<PSVector2i>,_std::equal_to<PSVector2i>,_std::allocator<PSVector2i>_>_>
              ::value((optional<std::unordered_set<PSVector2i,_std::hash<PSVector2i>,_std::equal_to<PSVector2i>,_std::allocator<PSVector2i>_>_>
                       *)local_58);
    sVar2 = std::
            unordered_set<PSVector2i,_std::hash<PSVector2i>,_std::equal_to<PSVector2i>,_std::allocator<PSVector2i>_>
            ::size(this_00);
    if (sVar2 == 0) {
      rule_delta.rule_application_deltas.
      super__Vector_base<PSEngine::RuleApplicationDelta,_std::allocator<PSEngine::RuleApplicationDelta>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
      goto LAB_00126c74;
    }
  }
  RuleDelta::RuleDelta
            ((RuleDelta *)&application_directions._M_t._M_impl.super__Rb_tree_header._M_node_count);
  get_absolute_directions_from_rule_direction
            ((set<PSEngine::AbsoluteDirection,_std::less<PSEngine::AbsoluteDirection>,_std::allocator<PSEngine::AbsoluteDirection>_>
              *)&__range1,this,
             *(RuleDirection *)
              (application_positions.
               super__Optional_base<std::unordered_set<PSVector2i,_std::hash<PSVector2i>,_std::equal_to<PSVector2i>,_std::allocator<PSVector2i>_>,_false,_false>
               ._M_payload.
               super__Optional_payload<std::unordered_set<PSVector2i,_std::hash<PSVector2i>,_std::equal_to<PSVector2i>,_std::allocator<PSVector2i>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::unordered_set<PSVector2i,_std::hash<PSVector2i>,_std::equal_to<PSVector2i>,_std::allocator<PSVector2i>_>_>
               ._56_8_ + 8));
  __end1 = std::
           set<PSEngine::AbsoluteDirection,_std::less<PSEngine::AbsoluteDirection>,_std::allocator<PSEngine::AbsoluteDirection>_>
           ::begin((set<PSEngine::AbsoluteDirection,_std::less<PSEngine::AbsoluteDirection>,_std::allocator<PSEngine::AbsoluteDirection>_>
                    *)&__range1);
  iStack_158 = std::
               set<PSEngine::AbsoluteDirection,_std::less<PSEngine::AbsoluteDirection>,_std::allocator<PSEngine::AbsoluteDirection>_>
               ::end((set<PSEngine::AbsoluteDirection,_std::less<PSEngine::AbsoluteDirection>,_std::allocator<PSEngine::AbsoluteDirection>_>
                      *)&__range1);
  while (bVar1 = std::operator!=(&__end1,&stack0xfffffffffffffea8), bVar1) {
    pAVar3 = std::_Rb_tree_const_iterator<PSEngine::AbsoluteDirection>::operator*(&__end1);
    compute_pattern_match_combinations._M_invoker._4_4_ = *pAVar3;
    local_1b0.p_rule =
         (Rule *)application_positions.
                 super__Optional_base<std::unordered_set<PSVector2i,_std::hash<PSVector2i>,_std::equal_to<PSVector2i>,_std::allocator<PSVector2i>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::unordered_set<PSVector2i,_std::hash<PSVector2i>,_std::equal_to<PSVector2i>,_std::allocator<PSVector2i>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::unordered_set<PSVector2i,_std::hash<PSVector2i>,_std::equal_to<PSVector2i>,_std::allocator<PSVector2i>_>_>
                 ._56_8_;
    local_1b0.rule_app_dir =
         (AbsoluteDirection *)((long)&compute_pattern_match_combinations._M_invoker + 4);
    local_1b0.rule_delta =
         (RuleDelta *)&application_directions._M_t._M_impl.super__Rb_tree_header._M_node_count;
    local_1b0.application_positions =
         (optional<std::unordered_set<PSVector2i,_std::hash<PSVector2i>,_std::equal_to<PSVector2i>,_std::allocator<PSVector2i>_>_>
          *)local_58;
    local_1b0.compute_pattern_match_combinations =
         (function<void_(int,_std::vector<PSEngine::PatternMatchInformation,_std::allocator<PSEngine::PatternMatchInformation>_>)>
          *)local_180;
    local_1b0.this = this;
    std::
    function<void(int,std::vector<PSEngine::PatternMatchInformation,std::allocator<PSEngine::PatternMatchInformation>>)>
    ::function<PSEngine::apply_rule(CompiledGame::Rule_const&)::__0,void>
              ((function<void(int,std::vector<PSEngine::PatternMatchInformation,std::allocator<PSEngine::PatternMatchInformation>>)>
                *)local_1b0.compute_pattern_match_combinations,&local_1b0);
    __range1_1 = (vector<PSEngine::RuleApplicationDelta,_std::allocator<PSEngine::RuleApplicationDelta>_>
                  *)0x0;
    pPStack_1c0 = (pointer)0x0;
    local_1b8 = (pointer)0x0;
    std::
    vector<PSEngine::PatternMatchInformation,_std::allocator<PSEngine::PatternMatchInformation>_>::
    vector((vector<PSEngine::PatternMatchInformation,_std::allocator<PSEngine::PatternMatchInformation>_>
            *)&__range1_1);
    std::
    function<void_(int,_std::vector<PSEngine::PatternMatchInformation,_std::allocator<PSEngine::PatternMatchInformation>_>)>
    ::operator()((function<void_(int,_std::vector<PSEngine::PatternMatchInformation,_std::allocator<PSEngine::PatternMatchInformation>_>)>
                  *)local_180,0,
                 (vector<PSEngine::PatternMatchInformation,_std::allocator<PSEngine::PatternMatchInformation>_>
                  *)&__range1_1);
    std::
    vector<PSEngine::PatternMatchInformation,_std::allocator<PSEngine::PatternMatchInformation>_>::
    ~vector((vector<PSEngine::PatternMatchInformation,_std::allocator<PSEngine::PatternMatchInformation>_>
             *)&__range1_1);
    std::
    function<void_(int,_std::vector<PSEngine::PatternMatchInformation,_std::allocator<PSEngine::PatternMatchInformation>_>)>
    ::~function((function<void_(int,_std::vector<PSEngine::PatternMatchInformation,_std::allocator<PSEngine::PatternMatchInformation>_>)>
                 *)local_180);
    std::_Rb_tree_const_iterator<PSEngine::AbsoluteDirection>::operator++(&__end1);
  }
  sVar4 = std::
          vector<PSEngine::RuleApplicationDelta,_std::allocator<PSEngine::RuleApplicationDelta>_>::
          size((vector<PSEngine::RuleApplicationDelta,_std::allocator<PSEngine::RuleApplicationDelta>_>
                *)&rule_delta.rule_applied.deltas.
                   super__Vector_base<CompiledGame::Delta,_std::allocator<CompiledGame::Delta>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage);
  if (sVar4 != 0) {
    CompiledGame::Rule::operator=
              ((Rule *)&rule_delta.movement_deltas.
                        super__Vector_base<PSEngine::MovementDelta,_std::allocator<PSEngine::MovementDelta>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (Rule *)application_positions.
                       super__Optional_base<std::unordered_set<PSVector2i,_std::hash<PSVector2i>,_std::equal_to<PSVector2i>,_std::allocator<PSVector2i>_>,_false,_false>
                       ._M_payload.
                       super__Optional_payload<std::unordered_set<PSVector2i,_std::hash<PSVector2i>,_std::equal_to<PSVector2i>,_std::allocator<PSVector2i>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::unordered_set<PSVector2i,_std::hash<PSVector2i>,_std::equal_to<PSVector2i>,_std::allocator<PSVector2i>_>_>
                       ._56_8_);
    this_01 = std::vector<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>::back
                        (&(this->m_turn_history).subturns);
    std::vector<PSEngine::RuleDelta,_std::allocator<PSEngine::RuleDelta>_>::push_back
              (&this_01->steps,
               (value_type *)
               &application_directions._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  this_02 = &rule_delta.rule_applied.deltas.
             super__Vector_base<CompiledGame::Delta,_std::allocator<CompiledGame::Delta>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  __end1_1 = std::
             vector<PSEngine::RuleApplicationDelta,_std::allocator<PSEngine::RuleApplicationDelta>_>
             ::begin((vector<PSEngine::RuleApplicationDelta,_std::allocator<PSEngine::RuleApplicationDelta>_>
                      *)this_02);
  delta = (RuleApplicationDelta *)
          std::
          vector<PSEngine::RuleApplicationDelta,_std::allocator<PSEngine::RuleApplicationDelta>_>::
          end((vector<PSEngine::RuleApplicationDelta,_std::allocator<PSEngine::RuleApplicationDelta>_>
               *)this_02);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<PSEngine::RuleApplicationDelta_*,_std::vector<PSEngine::RuleApplicationDelta,_std::allocator<PSEngine::RuleApplicationDelta>_>_>
                             *)&delta), bVar1) {
    p_delta = __gnu_cxx::
              __normal_iterator<PSEngine::RuleApplicationDelta_*,_std::vector<PSEngine::RuleApplicationDelta,_std::allocator<PSEngine::RuleApplicationDelta>_>_>
              ::operator*(&__end1_1);
    apply_delta(this,p_delta);
    __gnu_cxx::
    __normal_iterator<PSEngine::RuleApplicationDelta_*,_std::vector<PSEngine::RuleApplicationDelta,_std::allocator<PSEngine::RuleApplicationDelta>_>_>
    ::operator++(&__end1_1);
  }
  std::
  set<PSEngine::AbsoluteDirection,_std::less<PSEngine::AbsoluteDirection>,_std::allocator<PSEngine::AbsoluteDirection>_>
  ::~set((set<PSEngine::AbsoluteDirection,_std::less<PSEngine::AbsoluteDirection>,_std::allocator<PSEngine::AbsoluteDirection>_>
          *)&__range1);
  RuleDelta::~RuleDelta
            ((RuleDelta *)&application_directions._M_t._M_impl.super__Rb_tree_header._M_node_count);
  rule_delta.rule_application_deltas.
  super__Vector_base<PSEngine::RuleApplicationDelta,_std::allocator<PSEngine::RuleApplicationDelta>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
LAB_00126c74:
  std::
  optional<std::unordered_set<PSVector2i,_std::hash<PSVector2i>,_std::equal_to<PSVector2i>,_std::allocator<PSVector2i>_>_>
  ::~optional((optional<std::unordered_set<PSVector2i,_std::hash<PSVector2i>,_std::equal_to<PSVector2i>,_std::allocator<PSVector2i>_>_>
               *)local_58);
  return;
}

Assistant:

void PSEngine::apply_rule(const CompiledGame::Rule& p_rule)
{
    optional<unordered_set<PSVector2i>> application_positions = find_cells_for_rule_application(p_rule);

    if(application_positions.has_value() && application_positions.value().size() == 0)
    {
        //there is currently no cell where this rule could be applied in the level
        return;
    }

    RuleDelta rule_delta;

    set<AbsoluteDirection> application_directions = get_absolute_directions_from_rule_direction(p_rule.direction);

    for(auto rule_app_dir : application_directions)
    {
        std::function<void(int,vector<PatternMatchInformation>)> compute_pattern_match_combinations = [&](int rule_pattern_index, vector<PatternMatchInformation> current_match_combination){
            if(rule_pattern_index >= p_rule.match_patterns.size())
            {
                RuleApplicationDelta application_delta = translate_rule_delta(p_rule, rule_app_dir, current_match_combination);

                //do not add exactly identical deltas
                //todo this could and should probably done by the compiler (altough maybe not all equalities could be caught by the compiler)
                bool add_delta = true;
                string matched_delta_app_str = "";
                for(const auto& app_delta : rule_delta.rule_application_deltas)
                {
                    if(app_delta == application_delta)
                    {
                        add_delta = false;
                        matched_delta_app_str = enum_to_str(rule_app_dir, to_absolute_direction).value_or("error");
                        for(const auto& m : current_match_combination)
                        {
                            matched_delta_app_str += " ("+to_string(m.origin.x)+","+to_string(m.origin.y)+") ";
                        }

                        break;
                    }
                }

                string new_rule_match_str = enum_to_str(rule_app_dir, to_absolute_direction).value_or("error");
                for(const auto& m : current_match_combination)
                {
                    new_rule_match_str += " ("+to_string(m.origin.x)+","+to_string(m.origin.y)+") ";
                }

                if(add_delta)
                {
                    PS_LOG("Matched the rule at "+new_rule_match_str);
                    rule_delta.rule_application_deltas.push_back(application_delta);
                }
                else
                {
                    PS_LOG("Skipping match at "+new_rule_match_str+" since it equals match at "+matched_delta_app_str);

                }
            }
            else
            {
                //todo: for now only send the application position for the first pattern, this is a bit hacky
                vector<PatternMatchInformation> matched_patterns = match_pattern(p_rule.match_patterns[rule_pattern_index], rule_app_dir, (rule_pattern_index == 0) ? application_positions : nullopt);

                for(const auto& match : matched_patterns)
                {
                    vector<PatternMatchInformation> new_match_combination = current_match_combination;
                    new_match_combination.push_back(match);

                    compute_pattern_match_combinations(rule_pattern_index+1,new_match_combination);
                }
            }

        };

        compute_pattern_match_combinations(0, vector<PatternMatchInformation>());
    }

    //todo check if there is collision between deltas

    if(rule_delta.rule_application_deltas.size() > 0)
    {
        rule_delta.rule_applied = p_rule;
        m_turn_history.subturns.back().steps.push_back(rule_delta);
    }

    for(const RuleApplicationDelta& delta : rule_delta.rule_application_deltas)
    {
        apply_delta(delta);
    }
}